

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O0

RealType __thiscall OpenMD::LJ::getSigma(LJ *this,AtomType *atomType1,AtomType *atomType2)

{
  bool bVar1;
  AtomType *in_RDX;
  AtomType *in_RSI;
  locale *in_RDI;
  string DistanceMix;
  ForceFieldOptions *fopts;
  RealType sigma2;
  RealType sigma1;
  LennardJonesAdapter lja2;
  LennardJonesAdapter lja1;
  ForceFieldOptions *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  LennardJonesAdapter *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cont;
  locale local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ForceFieldOptions *local_48;
  RealType local_40;
  RealType local_38;
  LennardJonesAdapter local_30;
  LennardJonesAdapter local_28;
  AtomType *local_20;
  double local_8;
  
  local_20 = in_RDX;
  LennardJonesAdapter::LennardJonesAdapter(&local_28,in_RSI);
  this_00 = &local_30;
  LennardJonesAdapter::LennardJonesAdapter(this_00,local_20);
  local_38 = LennardJonesAdapter::getSigma(this_00);
  local_40 = LennardJonesAdapter::getSigma(this_00);
  local_48 = ForceField::getForceFieldOptions(*(ForceField **)(in_RDI + 0x78));
  cont = &local_68;
  ForceFieldOptions::getDistanceMixingRule_abi_cxx11_(in_stack_ffffffffffffff48);
  std::locale::locale(local_70);
  toUpper<std::__cxx11::string>(cont,in_RDI);
  std::locale::~locale(local_70);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    local_8 = sqrt(local_38 * local_40);
  }
  else {
    local_8 = (local_38 + local_40) * 0.5;
  }
  std::__cxx11::string::~string((string *)&local_68);
  return local_8;
}

Assistant:

RealType LJ::getSigma(AtomType* atomType1, AtomType* atomType2) {
    LennardJonesAdapter lja1 = LennardJonesAdapter(atomType1);
    LennardJonesAdapter lja2 = LennardJonesAdapter(atomType2);
    RealType sigma1          = lja1.getSigma();
    RealType sigma2          = lja2.getSigma();

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    string DistanceMix       = fopts.getDistanceMixingRule();
    toUpper(DistanceMix);

    if (DistanceMix == "GEOMETRIC")
      return sqrt(sigma1 * sigma2);
    else
      return 0.5 * (sigma1 + sigma2);
  }